

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void zeroblobFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int errCode;
  u64 uVar1;
  u64 n;
  
  uVar1 = sqlite3VdbeIntValue(*argv);
  n = 0;
  if (0 < (long)uVar1) {
    n = uVar1;
  }
  errCode = sqlite3_result_zeroblob64(context,n);
  if (errCode != 0) {
    sqlite3_result_error_code(context,errCode);
    return;
  }
  return;
}

Assistant:

static void zeroblobFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  i64 n;
  int rc;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  n = sqlite3_value_int64(argv[0]);
  if( n<0 ) n = 0;
  rc = sqlite3_result_zeroblob64(context, n); /* IMP: R-00293-64994 */
  if( rc ){
    sqlite3_result_error_code(context, rc);
  }
}